

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integrator.cpp
# Opt level: O0

void __thiscall OpenMD::Integrator::~Integrator(Integrator *this)

{
  void *pvVar1;
  undefined8 *in_RDI;
  Rattle *in_stack_ffffffffffffffc0;
  StatWriter *this_00;
  
  *in_RDI = &PTR__Integrator_005019d8;
  if ((long *)in_RDI[0x10] != (long *)0x0) {
    (**(code **)(*(long *)in_RDI[0x10] + 8))();
  }
  if ((long *)in_RDI[0x12] != (long *)0x0) {
    (**(code **)(*(long *)in_RDI[0x12] + 8))();
  }
  if ((long *)in_RDI[0x11] != (long *)0x0) {
    (**(code **)(*(long *)in_RDI[0x11] + 8))();
  }
  pvVar1 = (void *)in_RDI[0x13];
  if (pvVar1 != (void *)0x0) {
    Rattle::~Rattle(in_stack_ffffffffffffffc0);
    operator_delete(pvVar1,0x68);
  }
  pvVar1 = (void *)in_RDI[0x19];
  if (pvVar1 != (void *)0x0) {
    DumpWriter::~DumpWriter((DumpWriter *)in_stack_ffffffffffffffc0);
    operator_delete(pvVar1,0x60);
  }
  this_00 = (StatWriter *)in_RDI[0x18];
  if (this_00 != (StatWriter *)0x0) {
    (**(code **)(*(long *)this_00 + 8))();
  }
  pvVar1 = (void *)in_RDI[0x1a];
  if (pvVar1 != (void *)0x0) {
    StatWriter::~StatWriter(this_00);
    operator_delete(pvVar1,0x448);
  }
  std::unique_ptr<OpenMD::ProgressBar,_std::default_delete<OpenMD::ProgressBar>_>::~unique_ptr
            ((unique_ptr<OpenMD::ProgressBar,_std::default_delete<OpenMD::ProgressBar>_> *)this_00);
  std::unique_ptr<OpenMD::RNEMD::RNEMD,_std::default_delete<OpenMD::RNEMD::RNEMD>_>::~unique_ptr
            ((unique_ptr<OpenMD::RNEMD::RNEMD,_std::default_delete<OpenMD::RNEMD::RNEMD>_> *)this_00
            );
  std::unique_ptr<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_>::~unique_ptr
            ((unique_ptr<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_> *)this_00);
  return;
}

Assistant:

Integrator::~Integrator() {
    delete forceMan_;
    delete flucQ_;
    delete rotAlgo_;
    delete rattle_;
    delete dumpWriter;
    delete stats;
    delete statWriter;
  }